

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O2

pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_> *
__thiscall
jessilib::
split_once<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
          (pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> begin,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> end,
          char in_delim)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_end;
  _Vector_base<char,_std::allocator<char>_> local_70;
  pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_> local_58
  ;
  
  local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in_end._M_current = (char *)this;
  if (this < begin._M_current) {
    for (; in_end._M_current != begin._M_current; in_end._M_current = in_end._M_current + 1) {
      if (*in_end._M_current == (char)end._M_current) {
        make_split_member<std::vector<char,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_nullptr>
                  ((vector<char,_std::allocator<char>_> *)&local_70,
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)this,
                   in_end);
        std::vector<char,_std::allocator<char>_>::_M_move_assign(&local_58.first,&local_70);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_70);
        make_split_member<std::vector<char,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_nullptr>
                  ((vector<char,_std::allocator<char>_> *)&local_70,
                   (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                   (in_end._M_current + 1),begin);
        std::vector<char,_std::allocator<char>_>::_M_move_assign(&local_58.second,&local_70);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_70);
        (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        goto LAB_002bdbc4;
      }
    }
    make_split_member<std::vector<char,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_nullptr>
              ((vector<char,_std::allocator<char>_> *)&local_70,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)this,
               begin);
    std::vector<char,_std::allocator<char>_>::_M_move_assign(&local_58.first,&local_70);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_70);
    (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
LAB_002bdbc4:
    (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>::
  ~pair(&local_58);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}